

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.c
# Opt level: O2

void pnga_msg_sync(void)

{
  Integer IVar1;
  
  IVar1 = pnga_pgroup_get_default();
  if (0 < (int)(uint)IVar1) {
    armci_msg_group_barrier(&PGRP_LIST[(uint)IVar1 & 0x7fffffff].group);
    return;
  }
  armci_msg_barrier();
  return;
}

Assistant:

void pnga_msg_sync()
{
#ifdef MSG_COMMS_MPI
    int p_grp = (int)pnga_pgroup_get_default(); 
    if(p_grp>0)
       armci_msg_group_barrier(&(PGRP_LIST[p_grp].group));
    else
       armci_msg_barrier();
#else
     tcg_synch(GA_TYPE_SYN);
#endif
}